

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f *
Matrix4f::perspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fovYRadians,float aspect,float zNear,float zFar,
          bool directX)

{
  float fVar1;
  
  if (zNear < 0.0) {
    __assert_fail("zNear >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/vecmath/Matrix4f.cpp"
                  ,0x26a,
                  "static Matrix4f Matrix4f::perspectiveProjection(float, float, float, float, bool)"
                 );
  }
  if (0.0 < zFar) {
    __return_storage_ptr__->m_elements[0xc] = 0.0;
    __return_storage_ptr__->m_elements[0xd] = 0.0;
    __return_storage_ptr__->m_elements[0xe] = 0.0;
    __return_storage_ptr__->m_elements[0xf] = 0.0;
    __return_storage_ptr__->m_elements[8] = 0.0;
    __return_storage_ptr__->m_elements[9] = 0.0;
    __return_storage_ptr__->m_elements[10] = 0.0;
    __return_storage_ptr__->m_elements[0xb] = 0.0;
    __return_storage_ptr__->m_elements[4] = 0.0;
    __return_storage_ptr__->m_elements[5] = 0.0;
    __return_storage_ptr__->m_elements[6] = 0.0;
    __return_storage_ptr__->m_elements[7] = 0.0;
    __return_storage_ptr__->m_elements[0] = 0.0;
    __return_storage_ptr__->m_elements[1] = 0.0;
    __return_storage_ptr__->m_elements[2] = 0.0;
    __return_storage_ptr__->m_elements[3] = 0.0;
    fVar1 = tanf(fovYRadians * 0.5);
    __return_storage_ptr__->m_elements[0] = (1.0 / fVar1) / aspect;
    __return_storage_ptr__->m_elements[5] = 1.0 / fVar1;
    __return_storage_ptr__->m_elements[0xb] = -1.0;
    if (directX) {
      __return_storage_ptr__->m_elements[10] = zFar / (zNear - zFar);
      fVar1 = (zNear * zFar) / (zNear - zFar);
    }
    else {
      __return_storage_ptr__->m_elements[10] = (zNear + zFar) / (zNear - zFar);
      fVar1 = ((zFar + zFar) * zNear) / (zNear - zFar);
    }
    __return_storage_ptr__->m_elements[0xe] = fVar1;
    return __return_storage_ptr__;
  }
  __assert_fail("zFar > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/vecmath/Matrix4f.cpp"
                ,0x26b,
                "static Matrix4f Matrix4f::perspectiveProjection(float, float, float, float, bool)")
  ;
}

Assistant:

Matrix4f Matrix4f::perspectiveProjection( float fovYRadians, float aspect, float zNear, float zFar, bool directX )
{
	assert(zNear >= 0);
	assert(zFar > 0);
	Matrix4f m; // zero matrix

	float yScale = 1.f / tanf( 0.5f * fovYRadians );
	float xScale = yScale / aspect;

	m( 0, 0 ) = xScale;
	m( 1, 1 ) = yScale;
	m( 3, 2 ) = -1;

	if( directX )
	{
		m( 2, 2 ) = zFar / ( zNear - zFar );
		m( 2, 3 ) = zNear * zFar / ( zNear - zFar );
	}
	else
	{
		m( 2, 2 ) = ( zFar + zNear ) / ( zNear - zFar );
		m( 2, 3 ) = 2.f * zFar * zNear / ( zNear - zFar );
	}

	return m;
}